

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

Path * __thiscall tinyusdz::Path::operator=(Path *this,Path *rhs)

{
  Path *rhs_local;
  Path *this_local;
  
  this->_valid = (bool)(rhs->_valid & 1);
  ::std::__cxx11::string::operator=((string *)this,(string *)rhs);
  ::std::__cxx11::string::operator=((string *)&this->_prop_part,(string *)&rhs->_prop_part);
  ::std::__cxx11::string::operator=((string *)&this->_element,(string *)&rhs->_element);
  return this;
}

Assistant:

Path &operator=(const Path &rhs) {
    this->_valid = rhs._valid;

    this->_prim_part = rhs._prim_part;
    this->_prop_part = rhs._prop_part;
    this->_element = rhs._element;

    return (*this);
  }